

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

ostream * doctest::Color::operator<<(ostream *s,Enum code)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  if (*(char *)(in_FS_OFFSET + -0x38) == '\0') {
    iVar1 = isatty(1);
    if ((iVar1 != 0) || (*(char *)(detail::g_cs + 0x7d) != '\0')) {
      if (code - Red < 0x16) {
        pcVar3 = &DAT_00118154 + *(int *)(&DAT_00118154 + (ulong)(code - Red) * 4);
      }
      else {
        pcVar3 = "[0m";
      }
      poVar2 = std::operator<<(s,"\x1b");
      std::operator<<(poVar2,pcVar3);
    }
  }
  return s;
}

Assistant:

std::ostream& operator<<(std::ostream& s, Color::Enum code) {
        color_to_stream(s, code);
        return s;
    }